

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

int SSE4x4_SSE2(uint8_t *a,uint8_t *b)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [11];
  undefined1 auVar38 [13];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [15];
  unkuint9 Var43;
  undefined1 auVar44 [11];
  undefined1 auVar45 [13];
  undefined1 auVar46 [15];
  undefined1 auVar47 [11];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  
  uVar1 = *(undefined8 *)a;
  lVar2 = *(long *)(a + 0x20);
  auVar56._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar56._0_8_ = uVar1;
  auVar56._12_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar58._4_8_ = auVar56._8_8_;
  auVar58._0_4_ = (int)lVar2;
  auVar58._12_4_ = 0;
  auVar58 = auVar58 << 0x20;
  uVar3 = *(undefined8 *)(a + 0x40);
  lVar4 = *(long *)(a + 0x60);
  auVar59._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar59._0_8_ = uVar3;
  auVar59._12_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar61._4_8_ = auVar59._8_8_;
  auVar61._0_4_ = (int)lVar4;
  auVar61._12_4_ = 0;
  auVar61 = auVar61 << 0x20;
  uVar5 = *(undefined8 *)b;
  lVar6 = *(long *)(b + 0x20);
  auVar63._8_4_ = (int)((ulong)uVar5 >> 0x20);
  auVar63._0_8_ = uVar5;
  auVar63._12_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar62._4_8_ = auVar63._8_8_;
  auVar62._0_4_ = (int)lVar6;
  auVar62._12_4_ = 0;
  auVar62 = auVar62 << 0x20;
  uVar7 = *(undefined8 *)(b + 0x40);
  lVar8 = *(long *)(b + 0x60);
  auVar65._8_4_ = (int)((ulong)uVar7 >> 0x20);
  auVar65._0_8_ = uVar7;
  auVar65._12_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar64._4_8_ = auVar65._8_8_;
  auVar64._0_4_ = (int)lVar8;
  auVar64._12_4_ = 0;
  auVar64 = auVar64 << 0x20;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar58._0_13_;
  auVar12[0xe] = (char)((ulong)lVar2 >> 0x18);
  auVar16[0xc] = (char)((ulong)lVar2 >> 0x10);
  auVar16._0_12_ = auVar58._0_12_;
  auVar16._13_2_ = auVar12._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar58._0_11_;
  auVar20._12_3_ = auVar16._12_3_;
  auVar24[10] = (char)((ulong)lVar2 >> 8);
  auVar24._0_10_ = auVar58._0_10_;
  auVar24._11_4_ = auVar20._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar58._0_9_;
  auVar28._10_5_ = auVar24._10_5_;
  auVar32[8] = (char)lVar2;
  auVar32._0_8_ = lVar2 << 0x20;
  auVar32._9_6_ = auVar28._9_6_;
  auVar35._7_8_ = 0;
  auVar35._0_7_ = auVar32._8_7_;
  Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),(char)((ulong)uVar1 >> 0x18));
  auVar48._9_6_ = 0;
  auVar48._0_9_ = Var36;
  auVar37._1_10_ = SUB1510(auVar48 << 0x30,5);
  auVar37[0] = (char)((ulong)uVar1 >> 0x10);
  auVar49._11_4_ = 0;
  auVar49._0_11_ = auVar37;
  auVar38._1_12_ = SUB1512(auVar49 << 0x20,3);
  auVar38[0] = (char)((ulong)uVar1 >> 8);
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar61._0_13_;
  auVar9[0xe] = (char)((ulong)lVar4 >> 0x18);
  auVar13[0xc] = (char)((ulong)lVar4 >> 0x10);
  auVar13._0_12_ = auVar61._0_12_;
  auVar13._13_2_ = auVar9._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar61._0_11_;
  auVar17._12_3_ = auVar13._12_3_;
  auVar21[10] = (char)((ulong)lVar4 >> 8);
  auVar21._0_10_ = auVar61._0_10_;
  auVar21._11_4_ = auVar17._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar61._0_9_;
  auVar25._10_5_ = auVar21._10_5_;
  auVar29[8] = (char)lVar4;
  auVar29._0_8_ = lVar4 << 0x20;
  auVar29._9_6_ = auVar25._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar29._8_7_;
  Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),(char)((ulong)uVar3 >> 0x18));
  auVar50._9_6_ = 0;
  auVar50._0_9_ = Var40;
  auVar41._1_10_ = SUB1510(auVar50 << 0x30,5);
  auVar41[0] = (char)((ulong)uVar3 >> 0x10);
  auVar51._11_4_ = 0;
  auVar51._0_11_ = auVar41;
  auVar33[2] = (char)((ulong)uVar3 >> 8);
  auVar33._0_2_ = (ushort)uVar3;
  auVar33._3_12_ = SUB1512(auVar51 << 0x20,3);
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar62._0_13_;
  auVar10[0xe] = (char)((ulong)lVar6 >> 0x18);
  auVar14[0xc] = (char)((ulong)lVar6 >> 0x10);
  auVar14._0_12_ = auVar62._0_12_;
  auVar14._13_2_ = auVar10._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar62._0_11_;
  auVar18._12_3_ = auVar14._12_3_;
  auVar22[10] = (char)((ulong)lVar6 >> 8);
  auVar22._0_10_ = auVar62._0_10_;
  auVar22._11_4_ = auVar18._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar62._0_9_;
  auVar26._10_5_ = auVar22._10_5_;
  auVar30[8] = (char)lVar6;
  auVar30._0_8_ = lVar6 << 0x20;
  auVar30._9_6_ = auVar26._9_6_;
  auVar42._7_8_ = 0;
  auVar42._0_7_ = auVar30._8_7_;
  Var43 = CONCAT81(SUB158(auVar42 << 0x40,7),(char)((ulong)uVar5 >> 0x18));
  auVar52._9_6_ = 0;
  auVar52._0_9_ = Var43;
  auVar44._1_10_ = SUB1510(auVar52 << 0x30,5);
  auVar44[0] = (char)((ulong)uVar5 >> 0x10);
  auVar53._11_4_ = 0;
  auVar53._0_11_ = auVar44;
  auVar45._1_12_ = SUB1512(auVar53 << 0x20,3);
  auVar45[0] = (char)((ulong)uVar5 >> 8);
  auVar57._0_2_ = (ushort)(byte)uVar1 - (ushort)(byte)uVar5;
  auVar57._2_2_ = auVar38._0_2_ - auVar45._0_2_;
  auVar57._4_2_ = auVar37._0_2_ - auVar44._0_2_;
  auVar57._6_2_ = (short)Var36 - (short)Var43;
  auVar57._8_2_ = auVar32._8_2_ - auVar30._8_2_;
  auVar57._10_2_ = auVar24._10_2_ - auVar22._10_2_;
  auVar57._12_2_ = auVar16._12_2_ - auVar14._12_2_;
  auVar57._14_2_ = (auVar12._13_2_ >> 8) - (auVar10._13_2_ >> 8);
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar64._0_13_;
  auVar11[0xe] = (char)((ulong)lVar8 >> 0x18);
  auVar15[0xc] = (char)((ulong)lVar8 >> 0x10);
  auVar15._0_12_ = auVar64._0_12_;
  auVar15._13_2_ = auVar11._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar64._0_11_;
  auVar19._12_3_ = auVar15._12_3_;
  auVar23[10] = (char)((ulong)lVar8 >> 8);
  auVar23._0_10_ = auVar64._0_10_;
  auVar23._11_4_ = auVar19._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar64._0_9_;
  auVar27._10_5_ = auVar23._10_5_;
  auVar31[8] = (char)lVar8;
  auVar31._0_8_ = lVar8 << 0x20;
  auVar31._9_6_ = auVar27._9_6_;
  auVar46._7_8_ = 0;
  auVar46._0_7_ = auVar31._8_7_;
  Var36 = CONCAT81(SUB158(auVar46 << 0x40,7),(char)((ulong)uVar7 >> 0x18));
  auVar54._9_6_ = 0;
  auVar54._0_9_ = Var36;
  auVar47._1_10_ = SUB1510(auVar54 << 0x30,5);
  auVar47[0] = (char)((ulong)uVar7 >> 0x10);
  auVar55._11_4_ = 0;
  auVar55._0_11_ = auVar47;
  auVar34[2] = (char)((ulong)uVar7 >> 8);
  auVar34._0_2_ = (ushort)uVar7;
  auVar34._3_12_ = SUB1512(auVar55 << 0x20,3);
  auVar60._0_2_ = ((ushort)uVar3 & 0xff) - ((ushort)uVar7 & 0xff);
  auVar60._2_2_ = auVar33._2_2_ - auVar34._2_2_;
  auVar60._4_2_ = auVar41._0_2_ - auVar47._0_2_;
  auVar60._6_2_ = (short)Var40 - (short)Var36;
  auVar60._8_2_ = auVar29._8_2_ - auVar31._8_2_;
  auVar60._10_2_ = auVar21._10_2_ - auVar23._10_2_;
  auVar60._12_2_ = auVar13._12_2_ - auVar15._12_2_;
  auVar60._14_2_ = (auVar9._13_2_ >> 8) - (auVar11._13_2_ >> 8);
  auVar58 = pmaddwd(auVar57,auVar57);
  auVar61 = pmaddwd(auVar60,auVar60);
  return auVar61._12_4_ + auVar58._12_4_ + auVar61._4_4_ + auVar58._4_4_ +
         auVar61._8_4_ + auVar58._8_4_ + auVar61._0_4_ + auVar58._0_4_;
}

Assistant:

static int SSE4x4_SSE2(const uint8_t* a, const uint8_t* b) {
  const __m128i zero = _mm_setzero_si128();

  // Load values. Note that we read 8 pixels instead of 4,
  // but the a/b buffers are over-allocated to that effect.
  const __m128i a0 = _mm_loadl_epi64((const __m128i*)&a[BPS * 0]);
  const __m128i a1 = _mm_loadl_epi64((const __m128i*)&a[BPS * 1]);
  const __m128i a2 = _mm_loadl_epi64((const __m128i*)&a[BPS * 2]);
  const __m128i a3 = _mm_loadl_epi64((const __m128i*)&a[BPS * 3]);
  const __m128i b0 = _mm_loadl_epi64((const __m128i*)&b[BPS * 0]);
  const __m128i b1 = _mm_loadl_epi64((const __m128i*)&b[BPS * 1]);
  const __m128i b2 = _mm_loadl_epi64((const __m128i*)&b[BPS * 2]);
  const __m128i b3 = _mm_loadl_epi64((const __m128i*)&b[BPS * 3]);
  // Combine pair of lines.
  const __m128i a01 = _mm_unpacklo_epi32(a0, a1);
  const __m128i a23 = _mm_unpacklo_epi32(a2, a3);
  const __m128i b01 = _mm_unpacklo_epi32(b0, b1);
  const __m128i b23 = _mm_unpacklo_epi32(b2, b3);
  // Convert to 16b.
  const __m128i a01s = _mm_unpacklo_epi8(a01, zero);
  const __m128i a23s = _mm_unpacklo_epi8(a23, zero);
  const __m128i b01s = _mm_unpacklo_epi8(b01, zero);
  const __m128i b23s = _mm_unpacklo_epi8(b23, zero);
  // subtract, square and accumulate
  const __m128i d0 = _mm_subs_epi16(a01s, b01s);
  const __m128i d1 = _mm_subs_epi16(a23s, b23s);
  const __m128i e0 = _mm_madd_epi16(d0, d0);
  const __m128i e1 = _mm_madd_epi16(d1, d1);
  const __m128i sum = _mm_add_epi32(e0, e1);

  int32_t tmp[4];
  _mm_storeu_si128((__m128i*)tmp, sum);
  return (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
}